

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearSpeed::ArchiveOUT(ChLinkMotorLinearSpeed *this,ChArchiveOut *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorLinearSpeed>(marchive);
  ChLinkMotorLinear::ArchiveOUT(&this->super_ChLinkMotorLinear,marchive);
  local_30 = (bool *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_38 = "pos_offset";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->avoid_position_drift;
  local_38 = "avoid_position_drift";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorLinearSpeed>();

    // serialize parent class
    ChLinkMotorLinear::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(pos_offset);
    marchive << CHNVP(avoid_position_drift);
}